

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::prepare(DefaultsTest *this)

{
  GetTransformFeedbackiv_ProcAddress p_Var1;
  GetTransformFeedbacki_v_ProcAddress p_Var2;
  GetTransformFeedbacki64_v_ProcAddress p_Var3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  undefined1 local_198 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  p_Var1 = *(GetTransformFeedbackiv_ProcAddress *)(lVar6 + 0xb30);
  this->m_gl_getTransformFeedbackiv = p_Var1;
  p_Var2 = *(GetTransformFeedbacki_v_ProcAddress *)(lVar6 + 0xb28);
  this->m_gl_getTransformFeedbacki_v = p_Var2;
  p_Var3 = *(GetTransformFeedbacki64_v_ProcAddress *)(lVar6 + 0xb20);
  this->m_gl_getTransformFeedbacki64_v = p_Var3;
  if (((p_Var1 != (GetTransformFeedbackiv_ProcAddress)0x0) &&
      (p_Var2 != (GetTransformFeedbacki_v_ProcAddress)0x0)) &&
     (p_Var3 != (GetTransformFeedbacki64_v_ProcAddress)0x0)) {
    (**(code **)(lVar6 + 0x408))(1,&this->m_xfb_dsa);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCreateTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x139);
    (**(code **)(lVar6 + 0x868))(0x8c8b,&this->m_xfb_indexed_binding_points_count);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glIntegerv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x13d);
    return;
  }
  local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_198 + 8),"Function pointers are set to NULL values.",0x29);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_198);
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

void DefaultsTest::prepare()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbackiv	= (GetTransformFeedbackiv_ProcAddress)gl.getTransformFeedbackiv;
	m_gl_getTransformFeedbacki_v   = (GetTransformFeedbacki_v_ProcAddress)gl.getTransformFeedbacki_v;
	m_gl_getTransformFeedbacki64_v = (GetTransformFeedbacki64_v_ProcAddress)gl.getTransformFeedbacki64_v;

	if ((DE_NULL == m_gl_getTransformFeedbackiv) || (DE_NULL == m_gl_getTransformFeedbacki_v) ||
		(DE_NULL == m_gl_getTransformFeedbacki64_v))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	/* XFB object creation */
	gl.createTransformFeedbacks(1, &m_xfb_dsa);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Query limits. */
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &m_xfb_indexed_binding_points_count);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIntegerv have failed");
}